

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftmgr.c
# Opt level: O2

int ftmgr_aeq_handle(ftmgr *ftmgr,uint8_t aeq,uint8_t *offset)

{
  unsigned_long uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  undefined7 in_register_00000031;
  ulong uVar7;
  int *piVar8;
  unsigned_long uVar9;
  unsigned_long uVar10;
  bool bVar11;
  timeval local_40;
  
  uVar7 = CONCAT71(in_register_00000031,aeq);
  uVar5 = uVar7 & 0xffffffff;
  if ((ftmgr->bitmap >> ((uint)uVar7 & 0x1f) & 1) == 0) {
    piVar8 = (int *)ftmgr->ftq[uVar5].blk;
    if (*piVar8 == *(int *)offset) {
      ftmgr->tts = ftmgr->tts + -1;
      ftmgr->bitmap = (byte)(1 << (aeq & 0x1f)) | ftmgr->bitmap;
      lVar6 = (ulong)ftmgr->ftq[uVar5].size - 4;
      gettimeofday(&local_40,(__timezone_ptr_t)0x0);
      uVar10 = (ftmgr->pr).pr_cursize + lVar6;
      uVar9 = local_40.tv_sec * 1000000 + local_40.tv_usec;
      (ftmgr->pr).pr_cursize = uVar10;
      uVar7 = (ftmgr->pr).pr_total;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar7;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar10 * 100;
      uVar5 = SUB168(auVar3 / auVar2,0);
      if ((ftmgr->pr).pr_start == 0) {
        (ftmgr->pr).pr_start = uVar9;
      }
      uVar1 = (ftmgr->pr).pr_time;
      if (uVar1 != 0) {
        uVar4 = (long)((ulong)(uint)(SUB164(auVar3 / auVar2,0) >> 0x1f) << 0x20 | uVar5 & 0xffffffff
                      ) / 4;
        mgr_print((ftmgr->pr).chmgr,"%s %3d%% [%.*s%.*s] %ld B/s %ld/%ld KB    \r","send",uVar5,
                  uVar4 & 0xffffffff,"#########################",(ulong)(0x19 - (int)uVar4),
                  "                         ",(ulong)(lVar6 * 1000000) / (uVar9 - uVar1),
                  uVar10 >> 10,uVar7 >> 10);
        uVar7 = (ftmgr->pr).pr_total;
        uVar10 = (ftmgr->pr).pr_cursize;
      }
      if (uVar10 == uVar7) {
        uVar5 = uVar9 - (ftmgr->pr).pr_start;
        mgr_print((ftmgr->pr).chmgr,"\nTotal: %ld KB, %ld S, %ld B/s\n",uVar7 >> 10,uVar5 / 1000000,
                  (uVar7 * 1000000) / uVar5);
      }
      (ftmgr->pr).pr_time = uVar9;
      ftmgr_fill(ftmgr);
      ftmgr_timedout(ftmgr);
      goto LAB_0010261e;
    }
  }
  else {
    piVar8 = (int *)ftmgr->ftq[uVar5].blk;
  }
  if ((*piVar8 != *(int *)offset) && (((byte)loglevel & 1) != 0)) {
    syslog(3,"packted resend seq = %02x\n",uVar7 & 0xffffffff);
  }
LAB_0010261e:
  bVar11 = ftmgr->bitmap == 0xff;
  if (bVar11) {
    fm_write(ftmgr->chmgr,0x82,(void *)0x0,0);
  }
  return (uint)!bVar11;
}

Assistant:

int ftmgr_aeq_handle(struct ftmgr *ftmgr, uint8_t aeq, const uint8_t offset[4])
{
    if(!(ftmgr->bitmap & (1 << aeq)) && !memcmp(ftmgr->ftq[aeq].blk, offset, 4)) {
        ftmgr->tts--;
        ftmgr->bitmap |= (1 << aeq);
        progress(&ftmgr->pr, ftmgr->ftq[aeq].size - BLK_HDR_SIZE, "send");
        ftmgr_fill(ftmgr);
        ftmgr_timedout(ftmgr);
    } else if(memcmp(ftmgr->ftq[aeq].blk, offset, 4)) {
        LOGE("packted resend seq = %02x\n", aeq);
    }

    if(ftmgr->bitmap == (__typeof__(ftmgr->bitmap))-1) {
        fm_write(ftmgr->chmgr, CTRL_BLK_COMP, NULL, 0);
        return 0;
    }
    return 1;
}